

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O3

drwav_uint64 drwav_read_f32__mulaw(drwav *pWav,drwav_uint64 samplesToRead,float *pBufferOut)

{
  drwav_uint64 dVar1;
  size_t i;
  drwav_uint64 dVar2;
  ulong samplesToRead_00;
  drwav_uint64 dVar3;
  uchar sampleData [4096];
  byte local_1038 [4104];
  
  if ((pWav->bytesPerSample == 0) || (samplesToRead == 0)) {
    dVar3 = 0;
  }
  else {
    dVar3 = 0;
    do {
      samplesToRead_00 = (ulong)(0x1000 / pWav->bytesPerSample);
      if (samplesToRead < samplesToRead_00) {
        samplesToRead_00 = samplesToRead;
      }
      dVar1 = drwav_read(pWav,samplesToRead_00,local_1038);
      if (dVar1 == 0) {
        return dVar3;
      }
      if (pBufferOut != (float *)0x0) {
        dVar2 = 0;
        do {
          pBufferOut[dVar2] =
               (float)(int)(short)g_drwavMulawTable[local_1038[dVar2]] * 3.0517578e-05;
          dVar2 = dVar2 + 1;
        } while (dVar1 != dVar2);
      }
      pBufferOut = pBufferOut + dVar1;
      dVar3 = dVar3 + dVar1;
      samplesToRead = samplesToRead - dVar1;
    } while (samplesToRead != 0);
  }
  return dVar3;
}

Assistant:

drwav_uint64 drwav_read_f32__mulaw(drwav* pWav, drwav_uint64 samplesToRead, float* pBufferOut) {
    if (pWav->bytesPerSample == 0) {
        return 0;
    }

    drwav_uint64 totalSamplesRead = 0;
    unsigned char sampleData[4096];
    while (samplesToRead > 0) {
        drwav_uint64 samplesRead =
            drwav_read(pWav, drwav_min(samplesToRead, sizeof(sampleData) / pWav->bytesPerSample), sampleData);
        if (samplesRead == 0) {
            break;
        }

        drwav_mulaw_to_f32(pBufferOut, sampleData, (size_t)samplesRead);

        pBufferOut += samplesRead;
        samplesToRead -= samplesRead;
        totalSamplesRead += samplesRead;
    }

    return totalSamplesRead;
}